

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O1

uint aom_highbd_8_obmc_variance64x32_c
               (uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *mask,uint *sse)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  
  lVar6 = (long)pre * 2;
  iVar5 = 0;
  uVar1 = 0;
  iVar7 = 0;
  do {
    lVar2 = 0;
    do {
      iVar3 = wsrc[lVar2] - (uint)*(ushort *)(lVar6 + lVar2 * 2) * mask[lVar2];
      if (iVar3 < 0) {
        uVar4 = -(0x800U - iVar3 >> 0xc);
      }
      else {
        uVar4 = iVar3 + 0x800U >> 0xc;
      }
      iVar5 = iVar5 + uVar4;
      uVar1 = uVar1 + uVar4 * uVar4;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x40);
    wsrc = wsrc + 0x40;
    mask = mask + 0x40;
    iVar7 = iVar7 + 1;
    lVar6 = lVar6 + (long)pre_stride * 2;
  } while (iVar7 != 0x20);
  *sse = uVar1;
  return uVar1 - (int)((ulong)((long)iVar5 * (long)iVar5) >> 0xb);
}

Assistant:

static inline void highbd_obmc_variance64(const uint8_t *pre8, int pre_stride,
                                          const int32_t *wsrc,
                                          const int32_t *mask, int w, int h,
                                          uint64_t *sse, int64_t *sum) {
  int i, j;
  uint16_t *pre = CONVERT_TO_SHORTPTR(pre8);
  uint64_t tsse = 0;
  int64_t tsum = 0;

  for (i = 0; i < h; i++) {
    for (j = 0; j < w; j++) {
      int diff = ROUND_POWER_OF_TWO_SIGNED(wsrc[j] - pre[j] * mask[j], 12);
      tsum += diff;
      tsse += diff * diff;
    }

    pre += pre_stride;
    wsrc += w;
    mask += w;
  }
  *sse = tsse;
  *sum = tsum;
}